

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O3

_Bool parse_required(gravity_parser_t *parser,gtoken_t token)

{
  gravity_lexer_t *lexer;
  gtoken_s token_00;
  _Bool _Var1;
  gtoken_t token_01;
  char *pcVar2;
  char *pcVar3;
  undefined8 in_R9;
  gtoken_s unexpected_token;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  char *local_38;
  
  _Var1 = parse_optional(parser,token);
  if (!_Var1) {
    lexer = parser->lexer->p[parser->lexer->n - 1];
    token_01 = gravity_lexer_next(lexer);
    gravity_lexer_token(lexer);
    pcVar2 = token_name(token);
    pcVar3 = token_name(token_01);
    token_00.lineno = uStack_54;
    token_00.type = local_58;
    token_00.colno = uStack_50;
    token_00.position = uStack_4c;
    token_00.bytes = local_48;
    token_00.length = uStack_44;
    token_00.fileid = uStack_40;
    token_00.builtin = uStack_3c;
    token_00.value = local_38;
    report_error(parser,GRAVITY_ERROR_SYNTAX,token_00,"Expected %s but found %s.",pcVar2,pcVar3,
                 in_R9);
  }
  return _Var1;
}

Assistant:

static bool parse_required (gravity_parser_t *parser, gtoken_t token) {
    if (parse_optional(parser, token)) return true;

    // token not found (and not consumed) so an error strategy must be implemented here

    // simple (but not simpler) error recovery
    // parser should keep track of what I am parsing
    // so based on tok I could have a token list of terminal symbols
    // call next until first sync symbol (or EOF or start of another terminal symbol is found)

    // simple error recovery, just consume next and report error
    DECLARE_LEXER;
    gtoken_t next = gravity_lexer_next(lexer);
    gtoken_s unexpected_token = gravity_lexer_token(lexer);
    REPORT_ERROR(unexpected_token, "Expected %s but found %s.", token_name(token), token_name(next));
    return false;
}